

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O0

bool __thiscall CDBWrapper::WriteBatch(CDBWrapper *this,CDBBatch *batch,bool fSync)

{
  DB *pDVar1;
  string_view source_file;
  string_view logging_function;
  bool bVar2;
  size_t sVar3;
  LevelDBContext *pLVar4;
  pointer pWVar5;
  byte in_DL;
  CDBWrapper *in_RSI;
  long in_FS_OFFSET;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool log_memory;
  double mem_after;
  Status status;
  double mem_before;
  Level in_stack_000000d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000000e0;
  double *in_stack_000000e8;
  double *in_stack_000000f0;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  char *in_stack_ffffffffffffff40;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff48;
  WriteOptions *pWVar9;
  WriteOptions *status_00;
  int in_stack_ffffffffffffff9c;
  ConstevalFormatString<3U> in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe8;
  double dVar10;
  char *pcVar11;
  
  pcVar11 = *(char **)(in_FS_OFFSET + 0x28);
  bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),Trace);
  dVar10 = 0.0;
  if (bVar2) {
    sVar3 = DynamicMemoryUsage(in_RSI);
    auVar7._8_4_ = (int)(sVar3 >> 0x20);
    auVar7._0_8_ = sVar3;
    auVar7._12_4_ = 0x45300000;
    dVar10 = (((auVar7._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)) / 1024.0) / 1024.0;
  }
  pLVar4 = DBContext((CDBWrapper *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  pDVar1 = pLVar4->pdb;
  if ((in_DL & 1) == 0) {
    pLVar4 = DBContext((CDBWrapper *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    pWVar9 = &pLVar4->writeoptions;
  }
  else {
    pLVar4 = DBContext((CDBWrapper *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    pWVar9 = &pLVar4->syncoptions;
  }
  status_00 = pWVar9;
  pWVar5 = std::unique_ptr<CDBBatch::WriteBatchImpl,_std::default_delete<CDBBatch::WriteBatchImpl>_>
           ::operator->((unique_ptr<CDBBatch::WriteBatchImpl,_std::default_delete<CDBBatch::WriteBatchImpl>_>
                         *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  (*pDVar1->_vptr_DB[4])(&stack0xffffffffffffffe8,pDVar1,pWVar9,pWVar5);
  HandleError((Status *)status_00);
  if (bVar2) {
    sVar3 = DynamicMemoryUsage(in_RSI);
    auVar8._8_4_ = (int)(sVar3 >> 0x20);
    auVar8._0_8_ = sVar3;
    auVar8._12_4_ = 0x45300000;
    dVar6 = (((auVar8._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)) / 1024.0) / 1024.0;
    bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),Trace)
    ;
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      in_stack_ffffffffffffff28 = 1;
      logging_function._M_str = pcVar11;
      logging_function._M_len = (size_t)dVar10;
      source_file._M_str = in_stack_ffffffffffffffe8;
      source_file._M_len = (size_t)dVar6;
      LogPrintFormatInternal<std::__cxx11::string,double,double>
                (logging_function,source_file,in_stack_ffffffffffffff9c,0x1cef634,in_stack_000000d0,
                 in_stack_ffffffffffffffd8,in_stack_000000e0,in_stack_000000e8,in_stack_000000f0);
    }
  }
  leveldb::Status::~Status((Status *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if (*(char **)(in_FS_OFFSET + 0x28) != pcVar11) {
    __stack_chk_fail();
  }
  return true;
}

Assistant:

bool CDBWrapper::WriteBatch(CDBBatch& batch, bool fSync)
{
    const bool log_memory = LogAcceptCategory(BCLog::LEVELDB, BCLog::Level::Debug);
    double mem_before = 0;
    if (log_memory) {
        mem_before = DynamicMemoryUsage() / 1024.0 / 1024;
    }
    leveldb::Status status = DBContext().pdb->Write(fSync ? DBContext().syncoptions : DBContext().writeoptions, &batch.m_impl_batch->batch);
    HandleError(status);
    if (log_memory) {
        double mem_after = DynamicMemoryUsage() / 1024.0 / 1024;
        LogDebug(BCLog::LEVELDB, "WriteBatch memory usage: db=%s, before=%.1fMiB, after=%.1fMiB\n",
                 m_name, mem_before, mem_after);
    }
    return true;
}